

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_symbolic_physical.cpp
# Opt level: O0

void symbolic_to_physical(block_size_descriptor *bsd,symbolic_compressed_block *scb,uint8_t *pcb)

{
  byte bVar1;
  byte bVar2;
  quant_method qVar3;
  uint uVar4;
  int iVar5;
  block_mode *this;
  decimation_info *pdVar6;
  long lVar7;
  uint8_t *in_RDX;
  symbolic_compressed_block *in_RSI;
  block_size_descriptor *in_RDI;
  float fVar8;
  int j;
  int vals;
  uint i_10;
  uint8_t *pack_table;
  int valuecount_to_encode;
  uint8_t values_to_encode [32];
  int encoded_type_highpart_pos;
  int encoded_type_highpart_size;
  int encoded_type_highpart;
  int encoded_type_lowpart;
  int lowbits_of_format;
  uint i_9;
  int classbit_of_format;
  uint i_8;
  int bitpos;
  int encoded_type;
  int class_of_format;
  uint i_7;
  int low_class;
  int below_weights_pos;
  int i_6;
  int qwi_1;
  float qw_1;
  float uqw_1;
  int i_5;
  int qwi;
  float qw;
  float uqw;
  int i_4;
  uint8_t weights [64];
  int bits_for_weights;
  int real_weight_count;
  quant_and_transfer_table *qat;
  int is_dual_plane;
  float weight_quant_levels;
  quant_method weight_quant_method;
  int weight_count;
  decimation_info *di;
  block_mode *bm;
  uint8_t weightbuf [16];
  uint partition_count;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  int local_154;
  uint local_14c;
  undefined8 in_stack_fffffffffffffeb8;
  quant_method quant_level;
  uint in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  uint8_t local_138 [36];
  int local_114;
  int local_110;
  int local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  int local_fc;
  uint local_f8;
  int local_f4;
  uint local_f0;
  int local_ec;
  uint local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  float local_d4;
  float local_d0;
  int local_cc;
  int local_c8;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  uint8_t *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  quant_method in_stack_ffffffffffffff54;
  byte local_48 [28];
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint8_t *local_18;
  symbolic_compressed_block *local_10;
  block_size_descriptor *local_8;
  
  if (in_RSI->block_type == '\0') {
    __assert_fail("scb.block_type != SYM_BTYPE_ERROR",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_symbolic_physical.cpp"
                  ,0x6b,
                  "void symbolic_to_physical(const block_size_descriptor &, const symbolic_compressed_block &, uint8_t *)"
                 );
  }
  if (in_RSI->block_type == '\x02') {
    for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
      in_RDX[local_1c] = symbolic_to_physical::cbytes[local_1c];
    }
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      in_RDX[local_20 * 2 + 8] =
           (uint8_t)*(undefined4 *)(in_RSI->color_formats + (ulong)local_20 * 4 + 0xc);
      in_RDX[local_20 * 2 + 9] =
           (uint8_t)((uint)*(undefined4 *)(in_RSI->color_formats + (ulong)local_20 * 4 + 0xc) >> 8);
    }
  }
  else if (in_RSI->block_type == '\x01') {
    for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
      in_RDX[local_24] =
           symbolic_to_physical(block_size_descriptor_const&,symbolic_compressed_block_const&,unsigned_char*)
           ::cbytes[local_24];
    }
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      in_RDX[local_28 * 2 + 8] =
           (uint8_t)*(undefined4 *)(in_RSI->color_formats + (ulong)local_28 * 4 + 0xc);
      in_RDX[local_28 * 2 + 9] =
           (uint8_t)((uint)*(undefined4 *)(in_RSI->color_formats + (ulong)local_28 * 4 + 0xc) >> 8);
    }
  }
  else {
    local_2c = (uint)in_RSI->partition_count;
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[4] = 0;
    local_48[5] = 0;
    local_48[6] = 0;
    local_48[7] = 0;
    local_48[8] = 0;
    local_48[9] = 0;
    local_48[10] = 0;
    local_48[0xb] = 0;
    local_48[0xc] = 0;
    local_48[0xd] = 0;
    local_48[0xe] = 0;
    local_48[0xf] = 0;
    quant_level = (quant_method)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    this = block_size_descriptor::get_block_mode
                     ((block_size_descriptor *)
                      CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),quant_level);
    pdVar6 = block_size_descriptor::get_decimation_info(local_8,(uint)this->decimation_mode);
    bVar1 = pdVar6->weight_count;
    qVar3 = block_mode::get_weight_quant_mode(this);
    uVar4 = get_quant_level(qVar3);
    fVar8 = (float)uVar4;
    bVar2 = this->field_0x5 & 1;
    lVar7 = (ulong)qVar3 * 0xe2;
    uVar4 = get_ise_sequence_bitcount(in_stack_fffffffffffffec0,quant_level);
    if (bVar2 == 0) {
      for (local_cc = 0; local_cc < (int)(uint)bVar1; local_cc = local_cc + 1) {
        local_d0 = (float)local_10->weights[local_cc];
        local_d4 = (local_d0 / 64.0) * (fVar8 - 1.0);
        local_d8 = (int)(local_d4 + 0.5);
        (&stack0xffffffffffffff48)[local_cc] = *(undefined1 *)(lVar7 + 0x6b6e20 + (long)local_d8);
      }
    }
    else {
      for (in_stack_ffffffffffffff44 = 0; in_stack_ffffffffffffff44 < (int)(uint)bVar1;
          in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 + 1) {
        (&stack0xffffffffffffff48)[in_stack_ffffffffffffff44 * 2] =
             *(undefined1 *)
              (lVar7 + 0x6b6e20 +
              (long)(int)((float)local_10->weights[in_stack_ffffffffffffff44] * 0.015625 *
                          (fVar8 + -1.0) + 0.5));
        in_stack_ffffffffffffff40 = (float)local_10->weights[in_stack_ffffffffffffff44 + 0x20];
        in_stack_ffffffffffffff3c = (in_stack_ffffffffffffff40 / 64.0) * (fVar8 - 1.0);
        local_c8 = (int)(in_stack_ffffffffffffff3c + 0.5);
        (&stack0xffffffffffffff48)[in_stack_ffffffffffffff44 * 2 + 1] =
             *(undefined1 *)(lVar7 + 0x6b6e20 + (long)local_c8);
      }
    }
    encode_ise(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (uint)in_stack_ffffffffffffff3c);
    for (local_dc = 0; local_dc < 0x10; local_dc = local_dc + 1) {
      iVar5 = bitrev8((uint)local_48[0xf - local_dc]);
      local_18[local_dc] = (uint8_t)iVar5;
    }
    write_bits((uint)local_10->block_mode,0xb,0,local_18);
    write_bits(local_2c - 1,2,0xb,local_18);
    local_e0 = 0x80 - uVar4;
    if (local_2c < 2) {
      write_bits((uint)local_10->color_formats[0],4,0xd,local_18);
    }
    else {
      write_bits((uint)local_10->partition_index,6,0xd,local_18);
      write_bits((int)(uint)local_10->partition_index >> 6,4,0x13,local_18);
      if (local_10->color_formats_matched == '\0') {
        local_e4 = 4;
        for (local_e8 = 0; local_e8 < local_2c; local_e8 = local_e8 + 1) {
          local_ec = (int)(uint)local_10->color_formats[local_e8] >> 2;
          local_e4 = astc::min<int>(local_ec,local_e4);
        }
        if (local_e4 == 3) {
          local_e4 = 2;
        }
        local_f0 = local_e4 + 1;
        local_f4 = 2;
        for (local_f8 = 0; local_f8 < local_2c; local_f8 = local_f8 + 1) {
          local_fc = ((int)(uint)local_10->color_formats[local_f8] >> 2) - local_e4;
          local_f0 = local_fc << ((byte)local_f4 & 0x1f) | local_f0;
          local_f4 = local_f4 + 1;
        }
        for (local_100 = 0; local_100 < local_2c; local_100 = local_100 + 1) {
          local_104 = local_10->color_formats[local_100] & 3;
          local_f0 = local_104 << ((byte)local_f4 & 0x1f) | local_f0;
          local_f4 = local_f4 + 2;
        }
        local_108 = local_f0 & 0x3f;
        local_10c = (int)local_f0 >> 6;
        local_110 = local_2c * 3 + -4;
        local_114 = (0x80 - uVar4) - local_110;
        write_bits(local_108,6,0x17,local_18);
        write_bits(local_10c,local_110,local_114,local_18);
        local_e0 = local_e0 - local_110;
      }
      else {
        write_bits((uint)local_10->color_formats[0] << 2,6,0x17,local_18);
      }
    }
    if (bVar2 != 0) {
      write_bits((int)local_10->plane2_component,2,local_e0 + -2,local_18);
    }
    iVar5 = 0;
    qVar3 = local_10->quant_mode;
    for (local_14c = 0; local_14c < local_10->partition_count; local_14c = local_14c + 1) {
      uVar4 = ((int)(uint)local_10->color_formats[local_14c] >> 2) * 2 + 2;
      if (8 < uVar4) {
        __assert_fail("vals <= 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_symbolic_physical.cpp"
                      ,0x114,
                      "void symbolic_to_physical(const block_size_descriptor &, const symbolic_compressed_block &, uint8_t *)"
                     );
      }
      for (local_154 = 0; local_154 < (int)uVar4; local_154 = local_154 + 1) {
        local_138[local_154 + iVar5] =
             color_uquant_to_scrambled_pquant_tables[(int)(qVar3 - QUANT_6)]
             [local_10->color_formats[(long)local_154 + (ulong)local_14c * 8 + 0xc]];
      }
      iVar5 = uVar4 + iVar5;
    }
    symbolic_compressed_block::get_color_quant_mode(local_10);
    encode_ise(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (uint)in_stack_ffffffffffffff3c);
  }
  return;
}

Assistant:

void symbolic_to_physical(
	const block_size_descriptor& bsd,
	const symbolic_compressed_block& scb,
	uint8_t pcb[16]
) {
	assert(scb.block_type != SYM_BTYPE_ERROR);

	// Constant color block using UNORM16 colors
	if (scb.block_type == SYM_BTYPE_CONST_U16)
	{
		// There is currently no attempt to coalesce larger void-extents
		static const uint8_t cbytes[8] { 0xFC, 0xFD, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF };
		for (unsigned int i = 0; i < 8; i++)
		{
			pcb[i] = cbytes[i];
		}

		for (unsigned int i = 0; i < BLOCK_MAX_COMPONENTS; i++)
		{
			pcb[2 * i + 8] = scb.constant_color[i] & 0xFF;
			pcb[2 * i + 9] = (scb.constant_color[i] >> 8) & 0xFF;
		}

		return;
	}

	// Constant color block using FP16 colors
	if (scb.block_type == SYM_BTYPE_CONST_F16)
	{
		// There is currently no attempt to coalesce larger void-extents
		static const uint8_t cbytes[8]  { 0xFC, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF };
		for (unsigned int i = 0; i < 8; i++)
		{
			pcb[i] = cbytes[i];
		}

		for (unsigned int i = 0; i < BLOCK_MAX_COMPONENTS; i++)
		{
			pcb[2 * i + 8] = scb.constant_color[i] & 0xFF;
			pcb[2 * i + 9] = (scb.constant_color[i] >> 8) & 0xFF;
		}

		return;
	}

	unsigned int partition_count = scb.partition_count;

	// Compress the weights.
	// They are encoded as an ordinary integer-sequence, then bit-reversed
	uint8_t weightbuf[16] { 0 };

	const auto& bm = bsd.get_block_mode(scb.block_mode);
	const auto& di = bsd.get_decimation_info(bm.decimation_mode);
	int weight_count = di.weight_count;
	quant_method weight_quant_method = bm.get_weight_quant_mode();
	float weight_quant_levels = static_cast<float>(get_quant_level(weight_quant_method));
	int is_dual_plane = bm.is_dual_plane;

	const auto& qat = quant_and_xfer_tables[weight_quant_method];

	int real_weight_count = is_dual_plane ? 2 * weight_count : weight_count;

	int bits_for_weights = get_ise_sequence_bitcount(real_weight_count, weight_quant_method);

	uint8_t weights[64];
	if (is_dual_plane)
	{
		for (int i = 0; i < weight_count; i++)
		{
			float uqw = static_cast<float>(scb.weights[i]);
			float qw = (uqw / 64.0f) * (weight_quant_levels - 1.0f);
			int qwi = static_cast<int>(qw + 0.5f);
			weights[2 * i] = qat.scramble_map[qwi];

			uqw = static_cast<float>(scb.weights[i + WEIGHTS_PLANE2_OFFSET]);
			qw = (uqw / 64.0f) * (weight_quant_levels - 1.0f);
			qwi = static_cast<int>(qw + 0.5f);
			weights[2 * i + 1] = qat.scramble_map[qwi];
		}
	}
	else
	{
		for (int i = 0; i < weight_count; i++)
		{
			float uqw = static_cast<float>(scb.weights[i]);
			float qw = (uqw / 64.0f) * (weight_quant_levels - 1.0f);
			int qwi = static_cast<int>(qw + 0.5f);
			weights[i] = qat.scramble_map[qwi];
		}
	}

	encode_ise(weight_quant_method, real_weight_count, weights, weightbuf, 0);

	for (int i = 0; i < 16; i++)
	{
		pcb[i] = static_cast<uint8_t>(bitrev8(weightbuf[15 - i]));
	}

	write_bits(scb.block_mode, 11, 0, pcb);
	write_bits(partition_count - 1, 2, 11, pcb);

	int below_weights_pos = 128 - bits_for_weights;

	// Encode partition index and color endpoint types for blocks with 2+ partitions
	if (partition_count > 1)
	{
		write_bits(scb.partition_index, 6, 13, pcb);
		write_bits(scb.partition_index >> 6, PARTITION_INDEX_BITS - 6, 19, pcb);

		if (scb.color_formats_matched)
		{
			write_bits(scb.color_formats[0] << 2, 6, 13 + PARTITION_INDEX_BITS, pcb);
		}
		else
		{
			// Check endpoint types for each partition to determine the lowest class present
			int low_class = 4;

			for (unsigned int i = 0; i < partition_count; i++)
			{
				int class_of_format = scb.color_formats[i] >> 2;
				low_class = astc::min(class_of_format, low_class);
			}

			if (low_class == 3)
			{
				low_class = 2;
			}

			int encoded_type = low_class + 1;
			int bitpos = 2;

			for (unsigned int i = 0; i < partition_count; i++)
			{
				int classbit_of_format = (scb.color_formats[i] >> 2) - low_class;
				encoded_type |= classbit_of_format << bitpos;
				bitpos++;
			}

			for (unsigned int i = 0; i < partition_count; i++)
			{
				int lowbits_of_format = scb.color_formats[i] & 3;
				encoded_type |= lowbits_of_format << bitpos;
				bitpos += 2;
			}

			int encoded_type_lowpart = encoded_type & 0x3F;
			int encoded_type_highpart = encoded_type >> 6;
			int encoded_type_highpart_size = (3 * partition_count) - 4;
			int encoded_type_highpart_pos = 128 - bits_for_weights - encoded_type_highpart_size;
			write_bits(encoded_type_lowpart, 6, 13 + PARTITION_INDEX_BITS, pcb);
			write_bits(encoded_type_highpart, encoded_type_highpart_size, encoded_type_highpart_pos, pcb);
			below_weights_pos -= encoded_type_highpart_size;
		}
	}
	else
	{
		write_bits(scb.color_formats[0], 4, 13, pcb);
	}

	// In dual-plane mode, encode the color component of the second plane of weights
	if (is_dual_plane)
	{
		write_bits(scb.plane2_component, 2, below_weights_pos - 2, pcb);
	}

	// Encode the color components
	uint8_t values_to_encode[32];
	int valuecount_to_encode = 0;

	const uint8_t* pack_table = color_uquant_to_scrambled_pquant_tables[scb.quant_mode - QUANT_6];
	for (unsigned int i = 0; i < scb.partition_count; i++)
	{
		int vals = 2 * (scb.color_formats[i] >> 2) + 2;
		assert(vals <= 8);
		for (int j = 0; j < vals; j++)
		{
			values_to_encode[j + valuecount_to_encode] = pack_table[scb.color_values[i][j]];
		}
		valuecount_to_encode += vals;
	}

	encode_ise(scb.get_color_quant_mode(), valuecount_to_encode, values_to_encode, pcb,
	           scb.partition_count == 1 ? 17 : 19 + PARTITION_INDEX_BITS);
}